

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binds.cpp
# Opt level: O2

void __thiscall CBinds::Bind(CBinds *this,int KeyID,int Modifier,char *pStr)

{
  IConsole *pIVar1;
  char *pcVar2;
  char *format;
  uint uVar3;
  char (*dst) [128];
  long in_FS_OFFSET;
  char aBuf [256];
  char local_138 [264];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((uint)KeyID < 0x1da) {
    dst = this->m_aaaKeyBindings[(uint)KeyID] + Modifier;
    str_copy(*dst,pStr,0x80);
    uVar3 = Modifier - 1;
    if ((*dst)[0] == '\0') {
      if (uVar3 < 3) {
        pcVar2 = (&PTR_anon_var_dwarf_3bc69_00206a30)[uVar3];
      }
      else {
        pcVar2 = "";
      }
      format = "unbound %s%s (%d)";
    }
    else {
      if (uVar3 < 3) {
        pcVar2 = (&PTR_anon_var_dwarf_3bc69_00206a30)[uVar3];
      }
      else {
        pcVar2 = "";
      }
      format = "bound %s%s (%d) = %s";
    }
    str_format(local_138,0x100,format,pcVar2,g_aaKeyStrings + (uint)KeyID,(ulong)(uint)KeyID);
    pIVar1 = ((this->super_CComponent).m_pClient)->m_pConsole;
    (*(pIVar1->super_IInterface)._vptr_IInterface[0x19])(pIVar1,0,"binds",local_138,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CBinds::Bind(int KeyID, int Modifier, const char *pStr)
{
	if(KeyID < 0 || KeyID >= KEY_LAST)
		return;

	str_copy(m_aaaKeyBindings[KeyID][Modifier], pStr, sizeof(m_aaaKeyBindings[KeyID][Modifier]));
	char aBuf[256];
	if(!m_aaaKeyBindings[KeyID][Modifier][0])
		str_format(aBuf, sizeof(aBuf), "unbound %s%s (%d)", GetModifierName(Modifier),Input()->KeyName(KeyID), KeyID);
	else
		str_format(aBuf, sizeof(aBuf), "bound %s%s (%d) = %s", GetModifierName(Modifier),Input()->KeyName(KeyID), KeyID, m_aaaKeyBindings[KeyID][Modifier]);
	Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "binds", aBuf);
}